

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O3

QRect __thiscall
QFusionStyle::subControlRect
          (QFusionStyle *this,ComplexControl control,QStyleOptionComplex *option,
          SubControl subControl,QWidget *widget)

{
  QRect *pQVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  byte bVar4;
  undefined4 uVar5;
  undefined1 auVar6 [12];
  undefined4 uVar7;
  int iVar8;
  int iVar9;
  Representation RVar10;
  uint uVar11;
  int iVar12;
  QStyle *pQVar14;
  QStyle *pQVar15;
  uint uVar16;
  long lVar17;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar18;
  QStyleOptionComplex *extraout_RDX_02;
  ulong extraout_RDX_03;
  int iVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  LayoutDirection LVar24;
  Representation RVar25;
  int iVar26;
  Representation RVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  qreal qVar29;
  qreal qVar30;
  QRect QVar31;
  undefined1 auVar32 [16];
  QRect QVar33;
  int local_78;
  LayoutDirection local_58;
  undefined1 local_48 [8];
  Representation RStack_40;
  Representation RStack_3c;
  long local_38;
  ulong uVar13;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar31 = QCommonStyle::subControlRect(&this->super_QCommonStyle,control,option,subControl,widget);
  uVar21 = QVar31._8_8_;
  uVar13 = QVar31._0_8_;
  _local_48 = QVar31;
  if (CC_GroupBox < control) goto switchD_003baa17_caseD_2;
  uVar28 = uVar13 >> 0x20;
  switch(control) {
  case CC_SpinBox:
    if (((option != (QStyleOptionComplex *)0x0) && (0 < (option->super_QStyleOption).version)) &&
       ((option->super_QStyleOption).type == 0xf0002)) {
      iVar8 = (option->super_QStyleOption).rect.y2.m_i - (option->super_QStyleOption).rect.y1.m_i;
      bVar4 = (byte)option[1].super_QStyleOption.state.
                    super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                    super_QFlagsStorage<QStyle::StateFlag>.i;
      uVar11 = (uint)bVar4;
      uVar22 = 0xfffffffa;
      if (bVar4 == 0) {
        uVar22 = uVar11;
      }
      qVar30 = QStyleHelper::dpiScaled(14.0,&option->super_QStyleOption);
      if (subControl - SC_ComboBoxFrame < 8) {
        RVar10.m_i = (iVar8 - (iVar8 + 1 >> 0x1f)) + 1 >> 1;
        iVar20 = (int)qVar30;
        iVar8 = (uint)(bVar4 ^ 1) + (uint)(bVar4 ^ 1) * 2 + -3;
        iVar19 = (option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i
        ;
        RVar27.m_i = uVar11 * 3;
        iVar26 = (iVar8 - iVar20) + iVar19 + 1;
        RVar25.m_i = (iVar8 - iVar20) + iVar19 + 3;
        switch(subControl) {
        case SC_ComboBoxFrame:
          if (option[1].super_QStyleOption.version == 2) {
LAB_003bb170:
            QVar31 = (QRect)(ZEXT416((uint)RVar10.m_i) << 0x40);
            uVar21 = 0xffffffffffffffff;
            uVar28 = 0;
            goto LAB_003bb42e;
          }
          RStack_3c.m_i = RVar10.m_i - 1;
          local_48._4_4_ = RVar27.m_i;
          local_48._0_4_ = RVar25.m_i;
          RStack_40.m_i = iVar20 + iVar26 + 1;
LAB_003bb1b1:
          break;
        case SC_ComboBoxEditField:
          if (option[1].super_QStyleOption.version == 2) goto LAB_003bb170;
          local_48._4_4_ = RVar10.m_i;
          local_48._0_4_ = RVar25.m_i;
          RStack_40.m_i = iVar20 + iVar26 + 1;
          RStack_3c.m_i = iVar8 + (option->super_QStyleOption).rect.y2.m_i;
          break;
        case SC_ComboBoxArrow:
          _local_48 = (option->super_QStyleOption).rect;
          break;
        case SC_ComboBoxListBoxPopup:
          if (option[1].super_QStyleOption.version == 2) {
            RStack_3c.m_i =
                 (RVar27.m_i + uVar22 + (option->super_QStyleOption).rect.y2.m_i) -
                 (option->super_QStyleOption).rect.y1.m_i;
            local_48._4_4_ = RVar27.m_i;
            local_48._0_4_ = RVar27.m_i;
            RStack_40.m_i = RVar27.m_i + uVar22 + iVar19;
            goto LAB_003bb1b1;
          }
          iVar19 = 0;
          if (0 < RVar27.m_i + -1) {
            iVar19 = RVar27.m_i + -1;
          }
          local_48._4_4_ = RVar27.m_i;
          local_48._0_4_ = RVar27.m_i;
          RStack_40.m_i = ((RVar27.m_i + iVar8 + -1) - iVar19) + RVar25.m_i;
          RStack_3c.m_i =
               (uVar11 * -3 + (option->super_QStyleOption).rect.y2.m_i) -
               (option->super_QStyleOption).rect.y1.m_i;
        }
      }
      LVar24 = (option->super_QStyleOption).direction;
LAB_003bb40e:
      _local_48 = QStyle::visualRect(LVar24,&(option->super_QStyleOption).rect,(QRect *)local_48);
      uVar21 = local_48._8_8_;
    }
    break;
  case CC_ComboBox:
    if (subControl == SC_ComboBoxEditField) {
      _local_48 = QStyle::visualRect((option->super_QStyleOption).direction,
                                     &(option->super_QStyleOption).rect,(QRect *)local_48);
      uVar2 = (option->super_QStyleOption).rect.x1;
      uVar3 = (option->super_QStyleOption).rect.y1;
      iVar8 = (option->super_QStyleOption).rect.x2.m_i;
      qVar30 = QStyleHelper::dpiScaled(19.0,&option->super_QStyleOption);
      local_48._4_4_ = uVar3 + 2;
      local_48._0_4_ = uVar2 + 2;
      iVar20 = (uVar3 + (option->super_QStyleOption).rect.y2.m_i) -
               (option->super_QStyleOption).rect.y1.m_i;
      iVar19 = (iVar8 - (int)qVar30) + -2;
      RStack_40.m_i = iVar19;
      RVar27.m_i = iVar20 + -2;
      RStack_3c.m_i = RVar27.m_i;
      if (((0 < (option->super_QStyleOption).version) &&
          ((option->super_QStyleOption).type == 0xf0004)) &&
         ((char)option[1].super_QStyleOption.version == '\0')) {
        local_48._0_4_ = uVar2 + 4;
        if (((option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i & 0x24) != 0) {
          local_48._4_4_ = uVar3 + 3;
          local_48._0_4_ = uVar2 + 5;
          RStack_40.m_i = (iVar8 - (int)qVar30) + -1;
          RStack_3c.m_i = iVar20 + -1;
        }
      }
      LVar24 = (option->super_QStyleOption).direction;
      goto LAB_003bb40e;
    }
    if (subControl == SC_ComboBoxArrow) {
      qVar30 = QStyleHelper::dpi(&option->super_QStyleOption);
      pQVar1 = &(option->super_QStyleOption).rect;
      QVar31 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar1,(QRect *)local_48);
      _local_48 = QVar31;
      qVar29 = QStyleHelper::dpiScaled(18.0,qVar30);
      RVar25.m_i = QVar31.x2.m_i.m_i - (int)qVar29;
      uVar7 = local_48._4_4_;
      RVar27.m_i = local_48._4_4_ + -2;
      qVar30 = QStyleHelper::dpiScaled(19.0,qVar30);
      iVar8 = (uVar7 + RStack_3c.m_i) - local_48._4_4_;
      local_48._4_4_ = RVar27.m_i;
      local_48._0_4_ = RVar25.m_i;
      RStack_40.m_i = (int)qVar30 + RVar25.m_i + -1;
      RStack_3c.m_i = iVar8 + 2;
      _local_48 = QStyle::visualRect((option->super_QStyleOption).direction,pQVar1,(QRect *)local_48
                                    );
      uVar21 = local_48._8_8_;
    }
    break;
  case CC_Slider:
    if (((option != (QStyleOptionComplex *)0x0) && (0 < (option->super_QStyleOption).version)) &&
       ((option->super_QStyleOption).type == 0xf0001)) {
      pQVar14 = QStyle::proxy((QStyle *)
                              ((long)&switchD_003baa17::switchdataD_006cffac +
                              (long)(int)(&switchD_003baa17::switchdataD_006cffac)[control]));
      uVar22 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0xe,option,widget);
      RVar25 = QVar31.y1.m_i;
      RVar27 = QVar31.x1.m_i;
      if (subControl == SC_ComboBoxFrame) {
        lVar17 = (long)(option->super_QStyleOption).rect.x2.m_i +
                 (long)(option->super_QStyleOption).rect.x1.m_i;
        iVar8 = (int)((ulong)(lVar17 - (lVar17 >> 0x3f)) >> 1);
        lVar17 = (long)(option->super_QStyleOption).rect.y2.m_i +
                 (long)(option->super_QStyleOption).rect.y1.m_i;
        iVar19 = (int)((ulong)(lVar17 - (lVar17 >> 0x3f)) >> 1);
        qVar30 = QStyleHelper::dpiScaled(7.0,&option->super_QStyleOption);
        LVar24 = option[1].super_QStyleOption.direction;
        if (option[1].super_QStyleOption.version == 1) {
          RVar10.m_i = (int)qVar30 + -1 + RVar25.m_i;
          if (((LVar24 & (LayoutDirectionAuto|RightToLeft)) != (LayoutDirectionAuto|RightToLeft)) &&
             (iVar19 = iVar19 + (-(LVar24 & RightToLeft) & uVar22),
             (LVar24 & LayoutDirectionAuto) != LeftToRight)) {
            iVar19 = (iVar19 - uVar22) + 1;
          }
        }
        else {
          RStack_40.m_i = (int)qVar30 + -1 + RVar27.m_i;
          if (((LVar24 & (LayoutDirectionAuto|RightToLeft)) != (LayoutDirectionAuto|RightToLeft)) &&
             (iVar8 = iVar8 + (-(LVar24 & RightToLeft) & uVar22),
             (LVar24 & LayoutDirectionAuto) != LeftToRight)) {
            iVar8 = (iVar8 - uVar22) + 1;
          }
          RVar10 = QVar31.y2.m_i;
        }
        local_48._0_4_ = iVar8 - (RStack_40.m_i - RVar27.m_i) / 2;
        uVar22 = (RVar10.m_i - RVar25.m_i) / 2;
        uVar21 = (ulong)uVar22;
        local_48._4_4_ = iVar19 - uVar22;
        RStack_40.m_i = local_48._0_4_ + (RStack_40.m_i - RVar27.m_i);
        RStack_3c.m_i = local_48._4_4_ + (RVar10.m_i - RVar25.m_i);
      }
      else {
        uVar21 = extraout_RDX;
        if (subControl == SC_ComboBoxEditField) {
          iVar8 = option[1].super_QStyleOption.version;
          LVar24 = option[1].super_QStyleOption.direction;
          local_58 = LVar24 & (LayoutDirectionAuto|RightToLeft);
          pQVar14 = QStyle::proxy((QStyle *)(ulong)(LVar24 & (LayoutDirectionAuto|RightToLeft)));
          pQVar14 = (QStyle *)(**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0xb,option,widget);
          iVar19 = (int)pQVar14 + -1;
          iVar20 = -((int)(((uint)((ulong)pQVar14 >> 0x1f) & 1) + (int)pQVar14) >> 1);
          if (iVar8 == 1) {
            RStack_3c.m_i = RVar25.m_i + iVar19;
            pQVar14 = QStyle::proxy(pQVar14);
            iVar8 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0xd,option,widget);
            QVar31 = _local_48;
            RStack_40.m_i = iVar8 + RVar27.m_i + -1;
            lVar17 = (long)(option->super_QStyleOption).rect.y2.m_i +
                     (long)(option->super_QStyleOption).rect.y1.m_i;
            RVar27.m_i = iVar20 + (int)((ulong)(lVar17 - (lVar17 >> 0x3f)) >> 1);
            uVar21 = extraout_RDX_00;
            if (local_58 != (LayoutDirectionAuto|RightToLeft)) {
              LVar24 = option[1].super_QStyleOption.direction;
              uVar21 = (ulong)uVar22;
              RVar27.m_i = RVar27.m_i + (-(LVar24 & RightToLeft) & uVar22);
              if ((LVar24 & LayoutDirectionAuto) != LeftToRight) {
                RVar27.m_i = (RVar27.m_i - uVar22) + 1;
              }
            }
            RStack_3c.m_i = iVar19 + RVar27.m_i;
            local_48._0_4_ = QVar31.x1.m_i;
            local_48._4_4_ = RVar27.m_i;
          }
          else {
            RStack_40.m_i = iVar19 + RVar27.m_i;
            pQVar14 = QStyle::proxy((QStyle *)(ulong)(uint)(iVar19 + RVar27.m_i));
            iVar8 = (**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0xd,option,widget);
            lVar17 = (long)(option->super_QStyleOption).rect.x2.m_i +
                     (long)(option->super_QStyleOption).rect.x1.m_i;
            RVar27.m_i = iVar20 + (int)((ulong)(lVar17 - (lVar17 >> 0x3f)) >> 1);
            uVar21 = extraout_RDX_03;
            if (local_58 != (LayoutDirectionAuto|RightToLeft)) {
              LVar24 = option[1].super_QStyleOption.direction;
              uVar21 = (ulong)uVar22;
              RVar27.m_i = RVar27.m_i + (-(LVar24 & RightToLeft) & uVar22);
              if ((LVar24 & LayoutDirectionAuto) != LeftToRight) {
                RVar27.m_i = (RVar27.m_i - uVar22) + 1;
              }
            }
            RStack_40.m_i = iVar19 + RVar27.m_i;
            RStack_3c.m_i = iVar8 + RVar25.m_i + -1;
            local_48._0_4_ = RVar27.m_i;
          }
        }
      }
    }
    break;
  case CC_TitleBar:
    if (((option != (QStyleOptionComplex *)0x0) && (0 < (option->super_QStyleOption).version)) &&
       ((option->super_QStyleOption).type == 0xf0005)) {
      pQVar1 = &(option->super_QStyleOption).rect;
      iVar19 = (option->super_QStyleOption).rect.y1.m_i;
      iVar20 = (option->super_QStyleOption).rect.y2.m_i - iVar19;
      iVar8 = iVar20 + 1;
      uVar16 = iVar20 - 3;
      uVar22 = *(uint *)&option[1].super_QStyleOption.fontMetrics;
      uVar23 = 0;
      uVar11 = 0;
      if ((int)subControl < 0x20) {
        switch(subControl) {
        case SC_ComboBoxFrame:
          if ((option[1].super_QStyleOption.field_0x25 & 0x20) != 0) {
            iVar26 = (pQVar1->x1).m_i;
            local_48._4_4_ = iVar19 + 3;
            local_48._0_4_ = iVar26 + 5;
            RStack_40.m_i = iVar8 + iVar26 + -2;
            goto LAB_003bb3f7;
          }
          break;
        case SC_ComboBoxEditField:
switchD_003bad4e_caseD_2:
          if (((uVar22 & 1) == 0) && ((option[1].super_QStyleOption.field_0x25 & 0x40) != 0)) {
            uVar23 = uVar23 + uVar16;
LAB_003bb35f:
            if (((uVar22 & 2) == 0) || ((option[1].super_QStyleOption.field_0x25 & 0x80) == 0)) {
              if (subControl != SC_ScrollBarFirst) goto switchD_003bad4e_caseD_4;
              break;
            }
            uVar23 = uVar23 + uVar16;
            goto LAB_003bb38b;
          }
          if (subControl != SC_ComboBoxEditField) goto LAB_003bb34a;
          break;
        case SC_ComboBoxEditField|SC_ComboBoxFrame:
        case SC_ComboBoxArrow|SC_ComboBoxFrame:
        case SC_ComboBoxArrow|SC_ComboBoxEditField:
        case SC_ComboBoxArrow|SC_ComboBoxEditField|SC_ComboBoxFrame:
          break;
        case SC_ComboBoxArrow:
switchD_003bad4e_caseD_4:
          if (((uVar22 & 2) == 0) && ((option[1].super_QStyleOption.field_0x25 & 0x80) != 0)) {
            uVar11 = uVar23 + uVar16;
          }
          else {
LAB_003bb38b:
            uVar11 = uVar23;
            if (subControl == SC_ComboBoxArrow) break;
          }
LAB_003bb391:
          if (((uVar22 & 1) == 0) && ((option[1].super_QStyleOption.field_0x26 & 2) != 0)) {
            uVar23 = uVar11 + uVar16;
            goto LAB_003bb3bd;
          }
          uVar23 = uVar11;
          if (subControl != SC_ScrollBarLast) goto LAB_003bb3a4;
          break;
        case SC_ComboBoxListBoxPopup:
          uVar23 = 0;
          if ((option[1].super_QStyleOption.field_0x25 & 0x20) != 0) goto LAB_003bb3d6;
          break;
        default:
          if (subControl == SC_ScrollBarFirst) {
LAB_003bb34a:
            if (((uVar22 & 1) == 0) || ((option[1].super_QStyleOption.field_0x25 & 0x40) == 0))
            goto LAB_003bb35f;
            uVar23 = uVar23 + uVar16;
            goto switchD_003bad4e_caseD_4;
          }
        }
      }
      else {
        if (0x7f < (int)subControl) {
          if (subControl == SC_ScrollBarGroove) {
            uVar23 = (*(int *)&option[1].super_QStyleOption.field_0x24 << 0xf) >> 0x1f & uVar16;
            goto switchD_003bad4e_caseD_2;
          }
          if ((subControl == SC_TitleBarLabel) &&
             (uVar22 = *(uint *)&option[1].super_QStyleOption.field_0x24, (uVar22 & 0x3000) != 0)) {
            uVar5 = pQVar1->x1;
            QVar31 = *pQVar1;
            _local_48 = QVar31;
            if ((uVar22 >> 0xd & 1) != 0) {
              stack0xffffffffffffffbc = QVar31._4_12_;
              local_48._0_4_ = uVar5 + uVar16;
              QVar33 = _local_48;
              RStack_40 = QVar31.x2.m_i;
              RStack_3c = QVar31.y2.m_i;
              local_48 = QVar33._0_8_;
              RStack_40.m_i = (RStack_40.m_i - iVar8) + 4;
            }
            if ((uVar22 >> 0xe & 1) != 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar8) + 4;
            }
            if ((short)uVar22 < 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar8) + 4;
            }
            if ((uVar22 >> 0x11 & 1) != 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar8) + 4;
            }
            if ((uVar22 >> 0x10 & 1) != 0) {
              RStack_40.m_i = (RStack_40.m_i - iVar8) + 4;
            }
          }
          goto switchD_003bad4e_caseD_3;
        }
        if (subControl == SC_ScrollBarLast) goto LAB_003bb391;
        if (subControl != SC_ScrollBarSlider) goto switchD_003bad4e_caseD_3;
LAB_003bb3a4:
        if (((uVar22 & 1) == 0) ||
           (uVar22 = *(uint *)&option[1].super_QStyleOption.field_0x24, (uVar22 >> 0x11 & 1) == 0))
        {
LAB_003bb3bd:
          if (subControl == SC_ScrollBarSlider) goto switchD_003bad4e_caseD_3;
          uVar22 = *(uint *)&option[1].super_QStyleOption.field_0x24;
        }
        else {
          uVar23 = uVar23 + uVar16;
        }
        if ((uVar22 >> 0xd & 1) == 0) {
          if (subControl == SC_ComboBoxListBoxPopup) goto switchD_003bad4e_caseD_3;
        }
        else {
LAB_003bb3d6:
          uVar23 = uVar23 + uVar16;
        }
        iVar26 = (option->super_QStyleOption).rect.x2.m_i - uVar23;
        local_48._4_4_ = iVar19 + 3;
        local_48._0_4_ = iVar26 + -3;
        RStack_40.m_i = iVar8 + iVar26 + -10;
LAB_003bb3f7:
        local_48._0_4_ = local_48._0_4_;
        local_48._4_4_ = local_48._4_4_;
        RStack_3c.m_i = iVar19 + iVar20 + -3;
      }
switchD_003bad4e_caseD_3:
      LVar24 = (option->super_QStyleOption).direction;
      goto LAB_003bb40e;
    }
    break;
  case CC_GroupBox:
    if (((option == (QStyleOptionComplex *)0x0) || ((option->super_QStyleOption).version < 1)) ||
       ((option->super_QStyleOption).type != 0xf0006)) goto LAB_003bb42e;
    uVar22 = *(uint *)&option[1].super_QStyleOption.fontMetrics;
    lVar17._0_4_ = option[1].super_QStyleOption.rect.x2;
    lVar17._4_4_ = option[1].super_QStyleOption.rect.y2;
    if (lVar17 == 0) {
      iVar8 = 0;
      uVar18 = uVar21;
    }
    else {
      iVar8 = QFontMetrics::height();
      uVar18 = extraout_RDX_01;
    }
    QVar31.x2.m_i = (int)uVar18;
    QVar31.y2.m_i = (int)(uVar18 >> 0x20);
    QVar31.x1.m_i = (int)uVar13;
    QVar31.y1.m_i = (int)(uVar13 >> 0x20);
    if (subControl == SC_ComboBoxListBoxPopup) goto LAB_003bb42e;
    if (subControl == SC_ComboBoxArrow) {
      iVar19 = (option->super_QStyleOption).rect.x1.m_i;
      iVar20 = (option->super_QStyleOption).rect.y1.m_i;
      iVar26 = (option->super_QStyleOption).rect.x2.m_i;
      iVar12 = (option->super_QStyleOption).rect.y2.m_i;
      iVar9 = 0;
      if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
        iVar9 = (**(code **)(*(long *)&(this->super_QCommonStyle).super_QStyle + 0xe0))
                          (this,0x26,option,widget);
        option = extraout_RDX_02;
      }
      if (iVar8 < iVar9) {
        iVar8 = iVar9;
      }
      QVar31.y1.m_i = 0;
      QVar31.x1.m_i = iVar19 + 3;
      QVar31._8_8_ = option;
      uVar28 = (ulong)(iVar20 + iVar8 + 6);
      uVar21 = CONCAT44(iVar12 + -3,iVar26 + -3);
      goto LAB_003bb42e;
    }
    auVar32 = QFontMetrics::boundingRect((QString *)&(option->super_QStyleOption).fontMetrics);
    iVar19 = auVar32._8_4_ - auVar32._0_4_;
    pQVar14 = QStyle::proxy((QStyle *)(auVar32._0_8_ >> 0x20));
    pQVar14 = (QStyle *)(**(code **)(*(long *)pQVar14 + 0xe0))(pQVar14,0x25,option,widget);
    pQVar15 = QStyle::proxy(pQVar14);
    iVar8 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x26,option,widget);
    uVar23 = (int)pQVar14 + 5;
    _local_48 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
    iVar26 = iVar19 + (-((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
                         super_QFlagsStorage<QStyle::SubControl>.i & 1) & uVar23) + 3;
    iVar20 = ((option->super_QStyleOption).rect.x2.m_i - (option->super_QStyleOption).rect.x1.m_i) +
             1;
    uVar11 = iVar20 - iVar26;
    if (uVar11 != 0 && iVar26 <= iVar20) {
      uVar16 = uVar22 & 0x1e0;
      uVar22 = uVar22 & 0x1f;
      if (uVar22 == 1) {
        if (uVar16 == 0x80) {
          pQVar15 = QStyle::proxy((QStyle *)(ulong)uVar11);
          RVar27.m_i = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x4b,option,widget);
          iVar20 = RVar27.m_i - local_48._0_4_;
          RStack_40.m_i = RStack_40.m_i + iVar20;
          local_48._0_4_ = RVar27.m_i;
        }
      }
      else if (uVar22 == 2) {
        iVar12 = 0;
        if (uVar16 == 0x80) {
          pQVar15 = QStyle::proxy((QStyle *)0x0);
          iVar12 = (**(code **)(*(long *)pQVar15 + 0xe0))(pQVar15,0x4d,option,widget);
        }
        RVar27.m_i = iVar20 - (iVar26 + iVar12);
        iVar20 = RVar27.m_i - local_48._0_4_;
        RStack_40.m_i = RStack_40.m_i + iVar20;
        local_48._0_4_ = RVar27.m_i;
      }
      else if (uVar22 == 4) {
        auVar6._4_8_ = 0;
        auVar6._0_4_ = (int)uVar11 / 2 - 1;
        _local_48 = auVar6 << 0x40;
        RStack_3c.m_i = -1;
        local_48._0_4_ = (int)uVar11 / 2;
      }
    }
    RVar27.m_i = (auVar32._12_4_ - auVar32._4_4_) + 3;
    uVar7 = local_48._0_4_;
    if (subControl == SC_ComboBoxEditField) {
      iVar8 = iVar19 + local_48._0_4_ + 2;
      RStack_40.m_i = iVar8;
      RStack_3c.m_i = RVar27.m_i;
      local_48._4_4_ = 1;
      local_48 = (undefined1  [8])CONCAT44(local_48._4_4_,uVar7);
      if (((option->subControls).super_QFlagsStorageHelper<QStyle::SubControl,_4>.
           super_QFlagsStorage<QStyle::SubControl>.i & 1) != 0) {
        local_48._0_4_ = uVar7 + uVar23;
        RStack_40.m_i = iVar8 + uVar23;
      }
    }
    else if (subControl == SC_ComboBoxFrame) {
      local_48._4_4_ = 0;
      if (RVar27.m_i - iVar8 != 0 && iVar8 <= RVar27.m_i) {
        local_48._4_4_ = (RVar27.m_i - iVar8) / 2;
      }
      local_48._0_4_ = local_48._0_4_ + 1;
      RStack_40.m_i = (int)pQVar14 + uVar7;
      RStack_3c.m_i = iVar8 + -1 + local_48._4_4_;
    }
    QVar31 = QStyle::visualRect((option->super_QStyleOption).direction,
                                &(option->super_QStyleOption).rect,(QRect *)local_48);
    QVar33 = QVar31;
    goto LAB_003bb42a;
  }
switchD_003baa17_caseD_2:
  QVar33 = _local_48;
  QVar31.x2.m_i = (int)uVar21;
  QVar31.y2.m_i = (int)(uVar21 >> 0x20);
  QVar31.x1.m_i = local_48._0_4_;
  QVar31.y1.m_i = local_48._4_4_;
  _local_48 = QVar33;
LAB_003bb42a:
  uVar21 = QVar33._8_8_;
  uVar28 = QVar33._0_8_ >> 0x20;
LAB_003bb42e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar33._0_8_ = QVar31._0_8_ & 0xffffffff | uVar28 << 0x20;
  QVar33.x2.m_i = (int)uVar21;
  QVar33.y2.m_i = (int)(uVar21 >> 0x20);
  return QVar33;
}

Assistant:

QRect QFusionStyle::subControlRect(ComplexControl control, const QStyleOptionComplex *option,
                                   SubControl subControl, const QWidget *widget) const
{
    QRect rect = QCommonStyle::subControlRect(control, option, subControl, widget);

    switch (control) {
#if QT_CONFIG(slider)
    case CC_Slider:
        if (const QStyleOptionSlider *slider = qstyleoption_cast<const QStyleOptionSlider *>(option)) {
            int tickSize = proxy()->pixelMetric(PM_SliderTickmarkOffset, option, widget);
            switch (subControl) {
            case SC_SliderHandle: {
                const bool bothTicks = (slider->tickPosition & QSlider::TicksBothSides) == QSlider::TicksBothSides;
                if (slider->orientation == Qt::Horizontal) {
                    rect.setHeight(proxy()->pixelMetric(PM_SliderThickness, option, widget));
                    rect.setWidth(proxy()->pixelMetric(PM_SliderLength, option, widget));
                    int centerY = slider->rect.center().y() - rect.height() / 2;
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            centerY += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            centerY -= tickSize - 1;
                    }
                    rect.moveTop(centerY);
                } else {
                    rect.setWidth(proxy()->pixelMetric(PM_SliderThickness, option, widget));
                    rect.setHeight(proxy()->pixelMetric(PM_SliderLength, option, widget));
                    int centerX = slider->rect.center().x() - rect.width() / 2;
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            centerX += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            centerX -= tickSize - 1;
                    }
                    rect.moveLeft(centerX);
                }
            }
                break;
            case SC_SliderGroove: {
                QPoint grooveCenter = slider->rect.center();
                const int grooveThickness = QStyleHelper::dpiScaled(7, option);
                const bool bothTicks = (slider->tickPosition & QSlider::TicksBothSides) == QSlider::TicksBothSides;
                if (slider->orientation == Qt::Horizontal) {
                    rect.setHeight(grooveThickness);
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            grooveCenter.ry() += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            grooveCenter.ry() -= tickSize - 1;
                    }
                } else {
                    rect.setWidth(grooveThickness);
                    if (!bothTicks) {
                        if (slider->tickPosition & QSlider::TicksAbove)
                            grooveCenter.rx() += tickSize;
                        if (slider->tickPosition & QSlider::TicksBelow)
                            grooveCenter.rx() -= tickSize - 1;
                    }
                }
                rect.moveCenter(grooveCenter);
                break;
            }
            default:
                break;
            }
        }
        break;
#endif // QT_CONFIG(slider)
#if QT_CONFIG(spinbox)
    case CC_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(option)) {
            int center = spinbox->rect.height() / 2;
            int fw = spinbox->frame ? 3 : 0; // Is drawn with 3 pixels width in drawComplexControl, independently from PM_SpinBoxFrameWidth
            int y = fw;
            const int buttonWidth = QStyleHelper::dpiScaled(14, option);
            int x, lx, rx;
            x = spinbox->rect.width() - y - buttonWidth + 2;
            lx = fw;
            rx = x - fw;
            switch (subControl) {
            case SC_SpinBoxUp:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons)
                    return QRect();
                rect = QRect(x, fw, buttonWidth, center - fw);
                break;
            case SC_SpinBoxDown:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons)
                    return QRect();

                rect = QRect(x, center, buttonWidth, spinbox->rect.bottom() - center - fw + 1);
                break;
            case SC_SpinBoxEditField:
                if (spinbox->buttonSymbols == QAbstractSpinBox::NoButtons) {
                    rect = QRect(lx, fw, spinbox->rect.width() - 2*fw, spinbox->rect.height() - 2*fw);
                } else {
                    rect = QRect(lx, fw, rx - qMax(fw - 1, 0), spinbox->rect.height() - 2*fw);
                }
                break;
            case SC_SpinBoxFrame:
                rect = spinbox->rect;
                break;
            default:
                break;
            }
            rect = visualRect(spinbox->direction, spinbox->rect, rect);
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CC_GroupBox:
        if (const QStyleOptionGroupBox *groupBox = qstyleoption_cast<const QStyleOptionGroupBox *>(option)) {
            const int groupBoxTextAlignment = groupBox->textAlignment;
            const bool hasVerticalAlignment = (groupBoxTextAlignment & Qt::AlignVertical_Mask) == Qt::AlignVCenter;
            const int fontMetricsHeight = groupBox->text.isEmpty() ? 0 : groupBox->fontMetrics.height();

            if (subControl == SC_GroupBoxFrame)
                return rect;
            else if (subControl == SC_GroupBoxContents) {
                QRect frameRect = option->rect.adjusted(0, 0, 0, -groupBoxBottomMargin);
                int margin = 3;
                int leftMarginExtension = 0;
                const int indicatorHeight = option->subControls.testFlag(SC_GroupBoxCheckBox) ?
                                                        pixelMetric(PM_IndicatorHeight, option, widget) : 0;
                const int topMargin = qMax(indicatorHeight, fontMetricsHeight) +
                                        groupBoxTopMargin;
                return frameRect.adjusted(leftMarginExtension + margin, margin + topMargin, -margin, -margin - groupBoxBottomMargin);
            }

            QSize textSize = option->fontMetrics.boundingRect(groupBox->text).size() + QSize(2, 2);
            int indicatorWidth = proxy()->pixelMetric(PM_IndicatorWidth, option, widget);
            int indicatorHeight = proxy()->pixelMetric(PM_IndicatorHeight, option, widget);

            const int width = textSize.width()
                + (option->subControls & QStyle::SC_GroupBoxCheckBox ? indicatorWidth + 5 : 0);

            rect = QRect();

            if (option->rect.width() > width) {
                switch (groupBoxTextAlignment & Qt::AlignHorizontal_Mask) {
                case Qt::AlignHCenter:
                    rect.moveLeft((option->rect.width() - width) / 2);
                    break;
                case Qt::AlignRight:
                    rect.moveLeft(option->rect.width() - width
                                  - (hasVerticalAlignment ? proxy()->pixelMetric(PM_LayoutRightMargin, groupBox, widget) : 0));
                    break;
                case Qt::AlignLeft:
                    if (hasVerticalAlignment)
                        rect.moveLeft(proxy()->pixelMetric(PM_LayoutLeftMargin, option, widget));
                    break;
                }
            }

            if (subControl == SC_GroupBoxCheckBox) {
                rect.setWidth(indicatorWidth);
                rect.setHeight(indicatorHeight);
                rect.moveTop(textSize.height() > indicatorHeight ? (textSize.height() - indicatorHeight) / 2 : 0);
                rect.translate(1, 0);
            } else if (subControl == SC_GroupBoxLabel) {
                rect.setSize(textSize);
                rect.moveTop(1);
                if (option->subControls & QStyle::SC_GroupBoxCheckBox)
                    rect.translate(indicatorWidth + 5, 0);
            }
            return visualRect(option->direction, option->rect, rect);
        }

        return rect;

    case CC_ComboBox:
        switch (subControl) {
        case SC_ComboBoxArrow: {
            const qreal dpi = QStyleHelper::dpi(option);
            rect = visualRect(option->direction, option->rect, rect);
            rect.setRect(rect.right() - int(QStyleHelper::dpiScaled(18, dpi)), rect.top() - 2,
                         int(QStyleHelper::dpiScaled(19, dpi)), rect.height() + 4);
            rect = visualRect(option->direction, option->rect, rect);
        }
            break;
        case SC_ComboBoxEditField: {
            int frameWidth = 2;
            rect = visualRect(option->direction, option->rect, rect);
            rect.setRect(option->rect.left() + frameWidth, option->rect.top() + frameWidth,
                         option->rect.width() - int(QStyleHelper::dpiScaled(19, option)) - 2 * frameWidth,
                         option->rect.height() - 2 * frameWidth);
            if (const QStyleOptionComboBox *box = qstyleoption_cast<const QStyleOptionComboBox *>(option)) {
                if (!box->editable) {
                    rect.adjust(2, 0, 0, 0);
                    if (box->state & (State_Sunken | State_On))
                        rect.translate(1, 1);
                }
            }
            rect = visualRect(option->direction, option->rect, rect);
            break;
        }
        default:
            break;
        }
        break;
    case CC_TitleBar:
        if (const QStyleOptionTitleBar *tb = qstyleoption_cast<const QStyleOptionTitleBar *>(option)) {
            SubControl sc = subControl;
            QRect &ret = rect;
            const int indent = 3;
            const int controlTopMargin = 3;
            const int controlBottomMargin = 3;
            const int controlWidthMargin = 2;
            const int controlHeight = tb->rect.height() - controlTopMargin - controlBottomMargin ;
            const int delta = controlHeight + controlWidthMargin;
            int offset = 0;

            bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
            bool isMaximized = tb->titleBarState & Qt::WindowMaximized;

            switch (sc) {
            case SC_TitleBarLabel:
                if (tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)) {
                    ret = tb->rect;
                    if (tb->titleBarFlags & Qt::WindowSystemMenuHint)
                        ret.adjust(delta, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowMinimizeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowMaximizeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowShadeButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                    if (tb->titleBarFlags & Qt::WindowContextHelpButtonHint)
                        ret.adjust(0, 0, -delta, 0);
                }
                break;
            case SC_TitleBarContextHelpButton:
                if (tb->titleBarFlags & Qt::WindowContextHelpButtonHint)
                    offset += delta;
                Q_FALLTHROUGH();
            case SC_TitleBarMinButton:
                if (!isMinimized && (tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarMinButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarNormalButton:
                if (isMinimized && (tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    offset += delta;
                else if (isMaximized && (tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarNormalButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarMaxButton:
                if (!isMaximized && (tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarMaxButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarShadeButton:
                if (!isMinimized && (tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarShadeButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarUnshadeButton:
                if (isMinimized && (tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    offset += delta;
                else if (sc == SC_TitleBarUnshadeButton)
                    break;
                Q_FALLTHROUGH();
            case SC_TitleBarCloseButton:
                if (tb->titleBarFlags & Qt::WindowSystemMenuHint)
                    offset += delta;
                else if (sc == SC_TitleBarCloseButton)
                    break;
                ret.setRect(tb->rect.right() - indent - offset, tb->rect.top() + controlTopMargin,
                            controlHeight, controlHeight);
                break;
            case SC_TitleBarSysMenu:
                if (tb->titleBarFlags & Qt::WindowSystemMenuHint) {
                    ret.setRect(tb->rect.left() + controlWidthMargin + indent, tb->rect.top() + controlTopMargin,
                                controlHeight, controlHeight);
                }
                break;
            default:
                break;
            }
            ret = visualRect(tb->direction, tb->rect, ret);
        }
        break;
    default:
        break;
    }

    return rect;
}